

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O3

lzma_ret lzma_lzma2_props_encode(void *options,uint8_t *out)

{
  uint8_t uVar1;
  uint uVar2;
  
  uVar2 = 0xfff;
  if (0x1000 < *options) {
    uVar2 = *options - 1;
  }
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 3 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar2 = uVar2 >> 0x10 | uVar2;
  if (uVar2 == 0xffffffff) {
    uVar1 = '(';
  }
  else {
    if (uVar2 < 0x1fff) {
      uVar1 = ""[(ulong)uVar2 + 1];
    }
    else if (uVar2 < 0x1ffffff) {
      uVar1 = ""[uVar2 + 1 >> 0xc] + '\x18';
    }
    else {
      uVar1 = ""[uVar2 + 1 >> 0x18] + '0';
    }
    uVar1 = uVar1 + 0xe8;
  }
  *out = uVar1;
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_lzma2_props_encode(const void *options, uint8_t *out)
{
	const lzma_options_lzma *const opt = options;
	uint32_t d = my_max(opt->dict_size, LZMA_DICT_SIZE_MIN);

	// Round up to the next 2^n - 1 or 2^n + 2^(n - 1) - 1 depending
	// on which one is the next:
	--d;
	d |= d >> 2;
	d |= d >> 3;
	d |= d >> 4;
	d |= d >> 8;
	d |= d >> 16;

	// Get the highest two bits using the proper encoding:
	if (d == UINT32_MAX)
		out[0] = 40;
	else
		out[0] = get_pos_slot(d + 1) - 24;

	return LZMA_OK;
}